

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_memory_buffer<char,_123UL,_std::allocator<char>_>::grow
          (basic_memory_buffer<char,_123UL,_std::allocator<char>_> *this,size_t size)

{
  char *__src;
  size_t __n;
  char *__dest;
  ulong uVar1;
  
  uVar1 = (this->super_basic_buffer<char>).capacity_;
  uVar1 = (uVar1 >> 1) + uVar1;
  if (uVar1 <= size) {
    uVar1 = size;
  }
  if ((long)uVar1 < 0) {
    std::__throw_bad_alloc();
  }
  __src = (this->super_basic_buffer<char>).ptr_;
  __dest = (char *)operator_new(uVar1);
  __n = (this->super_basic_buffer<char>).size_;
  if (__n != 0) {
    memmove(__dest,__src,__n);
  }
  (this->super_basic_buffer<char>).ptr_ = __dest;
  (this->super_basic_buffer<char>).capacity_ = uVar1;
  if (__src != this->store_) {
    operator_delete(__src);
    return;
  }
  return;
}

Assistant:

FMT_CONSTEXPR T *begin(T (&array)[N]) FMT_NOEXCEPT { return array; }